

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O1

void __thiscall KDReports::Test::testSpreadSheetMode(Test *this)

{
  bool bVar1;
  char cVar2;
  undefined4 uVar3;
  QStandardItem *pQVar4;
  QObject *pQVar5;
  char *pcVar6;
  char *pcVar7;
  longlong __tmp;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QArrayDataPointer<char16_t> local_a8;
  QFile file;
  QStandardItemModel model;
  QArrayDataPointer<char16_t> local_70;
  Report report;
  QByteArrayView local_40;
  char *local_30;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  QStandardItemModel::QStandardItemModel(&model,(QObject *)0x0);
  pQVar4 = (QStandardItem *)operator_new(0x10);
  _file = "cell1";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,(char **)&file);
  QVar8.m_data = (storage_type *)local_40.m_size;
  QVar8.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar8);
  local_a8.d = local_70.d;
  local_a8.ptr = local_70.ptr;
  local_70.d = (Data *)0x0;
  local_70.ptr = (char16_t *)0x0;
  local_a8.size = local_70.size;
  local_70.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QStandardItem::QStandardItem(pQVar4,(QString *)&local_a8);
  QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  pQVar4 = (QStandardItem *)operator_new(0x10);
  _file = "cell2";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,(char **)&file);
  QVar9.m_data = (storage_type *)local_40.m_size;
  QVar9.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar9);
  local_a8.d = local_70.d;
  local_a8.ptr = local_70.ptr;
  local_70.d = (Data *)0x0;
  local_70.ptr = (char16_t *)0x0;
  local_a8.size = local_70.size;
  local_70.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QStandardItem::QStandardItem(pQVar4,(QString *)&local_a8);
  QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  _file = "table1";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,(char **)&file);
  QVar10.m_data = (storage_type *)local_40.m_size;
  QVar10.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar10);
  local_a8.d = local_70.d;
  local_a8.ptr = local_70.ptr;
  local_70.d = (Data *)0x0;
  local_70.ptr = (char16_t *)0x0;
  local_a8.size = local_70.size;
  local_70.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  KDReports::Report::associateModel((QString *)&report,(QAbstractItemModel *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  local_30 = ":/spreadsheet.xml";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,&local_30);
  QVar11.m_data = (storage_type *)local_40.m_size;
  QVar11.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar11);
  local_a8.d = local_70.d;
  local_a8.ptr = local_70.ptr;
  local_70.d = (Data *)0x0;
  local_70.ptr = (char16_t *)0x0;
  local_a8.size = local_70.size;
  local_70.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QFile::QFile(&file,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x14e);
  if (cVar2 != '\0') {
    bVar1 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x14f);
    if (cVar2 != '\0') {
      KDReports::Report::mainTable();
      KDReports::MainTable::autoTableElement();
      pQVar5 = (QObject *)KDReports::AutoTableElement::tableModel();
      pcVar6 = (char *)QTest::toString(pQVar5);
      pcVar7 = (char *)QTest::toString((QObject *)&model);
      cVar2 = QTest::compare_helper
                        (pQVar5 == (QObject *)&model,"Compared QObject pointers are not the same",
                         pcVar6,pcVar7,"report.mainTable()->autoTableElement()->tableModel()",
                         "baseModel",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x152);
      if (cVar2 != '\0') {
        uVar3 = KDReports::Report::pageOrientation();
        local_70.d = (Data *)CONCAT44(local_70.d._4_4_,uVar3);
        local_a8.d = (Data *)CONCAT44(local_a8.d._4_4_,1);
        QTest::qCompare<QPageLayout::Orientation,QPageLayout::Orientation>
                  ((Orientation *)&local_70,(Orientation *)&local_a8,"report.pageOrientation()",
                   "QPageLayout::Landscape",
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                   ,0x153);
      }
    }
  }
  QFile::~QFile(&file);
  QStandardItemModel::~QStandardItemModel(&model);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testSpreadSheetMode()
    {
        Report report;
        // TODO: make this part of the XML?
        report.setReportMode(Report::SpreadSheet);

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("cell1"));
        model.setItem(0, 1, new QStandardItem("cell2"));
        report.associateModel("table1", &model);

        QFile file(":/spreadsheet.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&file));

        QAbstractItemModel *baseModel = &model;
        QCOMPARE(report.mainTable()->autoTableElement()->tableModel(), baseModel);
        QCOMPARE(report.pageOrientation(), QPageLayout::Landscape);
    }